

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::
       doRound(IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<float,_4> *value)

{
  bool *pbVar1;
  double dVar2;
  long lVar3;
  Interval *pIVar4;
  int ndx;
  Interval local_60;
  Interval local_48;
  
  lVar3 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x68);
  lVar3 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x68);
  lVar3 = 0;
  pIVar4 = __return_storage_ptr__->m_data;
  do {
    dVar2 = (double)value->m_data[lVar3];
    local_60.m_hasNaN = NAN(value->m_data[lVar3]);
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar2;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar2;
    }
    tcu::FloatFormat::roundOut(&local_48,fmt,&local_60,false);
    pIVar4->m_hi = local_48.m_hi;
    pIVar4->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar4->field_0x1 = local_48._1_7_;
    pIVar4->m_lo = local_48.m_lo;
    lVar3 = lVar3 + 1;
    pIVar4 = pIVar4 + 1;
  } while (lVar3 != 4);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}